

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O0

bool __thiscall CBloomFilter::contains(CBloomFilter *this,COutPoint *outpoint)

{
  long lVar1;
  Span<const_unsigned_char> vKey;
  byte bVar2;
  size_t in_RSI;
  long in_FS_OFFSET;
  Span<unsigned_char> SVar3;
  DataStream stream;
  DataStream *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  DataStream *in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::DataStream(in_stack_ffffffffffffff68);
  DataStream::operator<<
            (in_stack_ffffffffffffff78,
             (COutPoint *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  SVar3 = MakeUCharSpan<DataStream&>(in_stack_ffffffffffffff78);
  Span<const_unsigned_char>::Span<unsigned_char,_0>
            ((Span<const_unsigned_char> *)in_stack_ffffffffffffff68,(Span<unsigned_char> *)0xd99d19)
  ;
  vKey.m_size = in_RSI;
  vKey.m_data = in_stack_ffffffffffffffa0;
  bVar2 = contains((CBloomFilter *)SVar3.m_data,vKey);
  DataStream::~DataStream(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CBloomFilter::contains(const COutPoint& outpoint) const
{
    DataStream stream{};
    stream << outpoint;
    return contains(MakeUCharSpan(stream));
}